

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

optional<CService> * GetLocalAddrForPeer(CNode *node)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  uint64_t uVar5;
  CNode *in_RDI;
  long in_FS_OFFSET;
  FastRandomContext rng;
  CService addrLocal;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  FastRandomContext *in_stack_fffffffffffffe38;
  CNode *in_stack_fffffffffffffe40;
  CService *in_stack_fffffffffffffe48;
  CNode *in_stack_fffffffffffffe58;
  undefined5 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  CNode *this;
  LogFlags in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  ConstevalFormatString<2U> in_stack_fffffffffffffed8;
  string_view in_stack_fffffffffffffee0;
  string_view in_stack_fffffffffffffef0;
  Level in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  long *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  GetLocalAddress(in_stack_fffffffffffffe58);
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffffe38,SUB81((ulong)in_stack_fffffffffffffe30 >> 0x38,0));
  bVar2 = IsPeerAddrLocalGood(in_stack_fffffffffffffe40);
  if (bVar2) {
    bVar2 = CNetAddr::IsRoutable((CNetAddr *)in_stack_fffffffffffffe38);
    if (bVar2) {
      GetnScore(in_stack_fffffffffffffe48);
      uVar5 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe48,
                         (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
      if (uVar5 != 0) goto LAB_00202948;
    }
    in_stack_fffffffffffffe67 =
         CNode::IsInboundConn
                   ((CNode *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    if ((bool)in_stack_fffffffffffffe67) {
      CNode::GetAddrLocal(this);
      CService::operator=((CService *)in_stack_fffffffffffffe38,
                          (CService *)in_stack_fffffffffffffe30);
      CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
      ;
    }
    else {
      CNode::GetAddrLocal(this);
      CNetAddr::SetIP((CNetAddr *)in_stack_fffffffffffffe38,(CNetAddr *)in_stack_fffffffffffffe30);
      CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
      ;
    }
  }
LAB_00202948:
  uVar3 = CNetAddr::IsRoutable((CNetAddr *)in_stack_fffffffffffffe38);
  if ((bool)uVar3) {
    uVar4 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),Trace);
    if ((bool)uVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48,
                 (char *)in_stack_fffffffffffffe40);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48,
                 (char *)in_stack_fffffffffffffe40);
      CService::ToStringAddrPort_abi_cxx11_
                ((CService *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(uVar3,CONCAT15(uVar4,in_stack_fffffffffffffe60))));
      CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      in_stack_fffffffffffffe38 = (FastRandomContext *)&stack0xfffffffffffffed8;
      in_stack_fffffffffffffe30 = "Advertising address %s to peer=%d\n";
      in_stack_fffffffffffffe28 = 1;
      LogPrintFormatInternal<std::__cxx11::string,long>
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee0,in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe90,in_stack_ffffffffffffffd0,in_stack_fffffffffffffed8,
                 in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    std::optional<CService>::optional<CService,_true>
              ((optional<CService> *)in_stack_fffffffffffffe38,(CService *)in_stack_fffffffffffffe30
              );
  }
  else {
    std::optional<CService>::optional((optional<CService> *)this);
  }
  FastRandomContext::~FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<CService> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CService> GetLocalAddrForPeer(CNode& node)
{
    CService addrLocal{GetLocalAddress(node)};
    // If discovery is enabled, sometimes give our peer the address it
    // tells us that it sees us as in case it has a better idea of our
    // address than we do.
    FastRandomContext rng;
    if (IsPeerAddrLocalGood(&node) && (!addrLocal.IsRoutable() ||
         rng.randbits((GetnScore(addrLocal) > LOCAL_MANUAL) ? 3 : 1) == 0))
    {
        if (node.IsInboundConn()) {
            // For inbound connections, assume both the address and the port
            // as seen from the peer.
            addrLocal = CService{node.GetAddrLocal()};
        } else {
            // For outbound connections, assume just the address as seen from
            // the peer and leave the port in `addrLocal` as returned by
            // `GetLocalAddress()` above. The peer has no way to observe our
            // listening port when we have initiated the connection.
            addrLocal.SetIP(node.GetAddrLocal());
        }
    }
    if (addrLocal.IsRoutable()) {
        LogDebug(BCLog::NET, "Advertising address %s to peer=%d\n", addrLocal.ToStringAddrPort(), node.GetId());
        return addrLocal;
    }
    // Address is unroutable. Don't advertise.
    return std::nullopt;
}